

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O2

Vec_Int_t * Amap_CreateRulesFromDsd(Amap_Lib_t *pLib,Kit_DsdNtk_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int i;
  
  if (1 < p->nVars) {
    p_00 = Amap_CreateRulesFromDsd_rec(pLib,p,p->Root & 0xfffffffe);
    if (p_00 != (Vec_Int_t *)0x0) {
      iVar1 = Abc_LitIsCompl((uint)p->Root);
      if (iVar1 != 0) {
        iVar1 = p_00->nSize;
        i = 0;
        if (iVar1 < 1) {
          iVar1 = 0;
          i = 0;
        }
        for (; iVar1 != i; i = i + 1) {
          iVar2 = Vec_IntEntry(p_00,i);
          iVar2 = Abc_LitNot(iVar2);
          Vec_IntWriteEntry(p_00,i,iVar2);
        }
      }
    }
    return p_00;
  }
  __assert_fail("p->nVars >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                ,0xed,"Vec_Int_t *Amap_CreateRulesFromDsd(Amap_Lib_t *, Kit_DsdNtk_t *)");
}

Assistant:

Vec_Int_t * Amap_CreateRulesFromDsd( Amap_Lib_t * pLib, Kit_DsdNtk_t * p )
{
    Vec_Int_t * vNods;
    int iNod, i;
    assert( p->nVars >= 2 );
    vNods = Amap_CreateRulesFromDsd_rec( pLib, p, Abc_LitRegular(p->Root) );
    if ( vNods == NULL )
        return NULL;
    if ( Abc_LitIsCompl(p->Root) )
    {
        Vec_IntForEachEntry( vNods, iNod, i )
            Vec_IntWriteEntry( vNods, i, Abc_LitNot(iNod) );
    }
    return vNods;
}